

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,ArrayPtr<const_char> *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,StringTree *params_7,ArrayPtr<const_char> *params_8)

{
  Branch *pBVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  char *__n;
  Branch *pBVar4;
  size_t sVar5;
  long lVar6;
  size_t result_2;
  char *pos;
  char *local_a8 [3];
  size_t sStack_90;
  size_t local_88;
  size_t sStack_80;
  size_t local_78;
  char *local_70;
  char *local_68;
  String local_60;
  StringTree *local_48;
  StringTree *local_40;
  StringTree *local_38;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  local_a8[0] = (this->text).content.ptr;
  local_a8[1] = params->ptr;
  local_a8[2] = (params_1->text).content.ptr;
  sStack_90 = params_2->size_;
  local_88 = params_3->size_;
  sStack_80 = params_4->size_;
  local_78 = params_5->size_;
  local_70 = params_6->ptr;
  local_68 = (params_7->text).content.ptr;
  sVar5 = 0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_a8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x48);
  __return_storage_ptr__->size_ = sVar5;
  sVar5 = 0;
  local_a8[1] = (char *)0x0;
  local_70 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_a8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x48);
  local_48 = this;
  local_40 = (StringTree *)params;
  local_38 = params_1;
  heapString(&local_60,sVar5);
  (__return_storage_ptr__->text).content.ptr = local_60.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_60.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_60.content.disposer;
  sVar5 = 0;
  local_a8[0] = (char *)0x0;
  local_a8[1] = (char *)0x1;
  local_a8[2] = (char *)0x0;
  sStack_90 = 0;
  local_88 = 0;
  sStack_80 = 0;
  local_78 = 0;
  local_70 = (char *)0x1;
  local_68 = (char *)0x0;
  lVar6 = 0;
  do {
    sVar5 = sVar5 + *(long *)((long)local_a8 + lVar6);
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x48);
  pBVar4 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,sVar5,sVar5,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      construct,
                      _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch,_false,_false>::
                      destruct);
  local_60.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar1 = (__return_storage_ptr__->branches).ptr;
  local_60.content.ptr = (char *)pBVar4;
  local_60.content.size_ = sVar5;
  if (pBVar1 != (Branch *)0x0) {
    sVar2 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar3 = (__return_storage_ptr__->branches).disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pBVar1,0x40,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = pBVar4;
  (__return_storage_ptr__->branches).size_ = sVar5;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pos = (char *)(__return_storage_ptr__->text).content.size_;
  if (pos != (char *)0x0) {
    pos = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_48->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pos,(void *)local_48->size_,(size_t)__n);
    pos = pos + (long)__n;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pos,0,local_40,(ArrayPtr<const_char> *)local_38,params_2,
             params_3,params_4,params_5,(StringTree *)params_6,(ArrayPtr<const_char> *)params_7);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}